

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

void Gia_ManConvertPackingToEdges(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  int iVar9;
  int iVar10;
  int iVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint *puVar20;
  int nNodes [4];
  uint local_48 [4];
  long local_38;
  
  if (p->vPacking != (Vec_Int_t *)0x0) {
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      piVar7 = p->vEdge1->pArray;
      if (piVar7 != (int *)0x0) {
        free(piVar7);
        p->vEdge1->pArray = (int *)0x0;
      }
      if (p->vEdge1 != (Vec_Int_t *)0x0) {
        free(p->vEdge1);
        p->vEdge1 = (Vec_Int_t *)0x0;
      }
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      piVar7 = p->vEdge2->pArray;
      if (piVar7 != (int *)0x0) {
        free(piVar7);
        p->vEdge2->pArray = (int *)0x0;
      }
      if (p->vEdge2 != (Vec_Int_t *)0x0) {
        free(p->vEdge2);
        p->vEdge2 = (Vec_Int_t *)0x0;
      }
    }
    iVar1 = p->nObjs;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar9 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar9 = iVar1;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar9;
    local_38 = (long)iVar9;
    if (iVar9 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc(local_38 * 4);
    }
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar1;
    __s = (int *)0x0;
    memset(piVar7,0,(long)iVar1 << 2);
    p->vEdge1 = pVVar6;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nSize = 0;
    pVVar8->nCap = iVar9;
    if (iVar9 != 0) {
      __s = (int *)malloc(local_38 << 2);
    }
    pVVar8->pArray = __s;
    pVVar8->nSize = iVar1;
    iVar9 = 0;
    memset(__s,0,(long)iVar1 << 2);
    p->vEdge2 = pVVar8;
    pVVar3 = p->vPacking;
    if (pVVar3->nSize < 1) {
LAB_006b6c46:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar4 = pVVar3->pArray;
    iVar1 = *piVar4;
    iVar16 = pVVar3->nSize;
    iVar17 = 0;
    if (1 < iVar16) {
      uVar13 = 1;
      iVar17 = 0;
      iVar9 = 0;
      do {
        if ((int)uVar13 < 0) goto LAB_006b6c46;
        uVar2 = piVar4[uVar13];
        if (2 < uVar2 - 1) {
          __assert_fail("Entry > 0 && Entry < 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                        ,0x84,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
        }
        uVar14 = uVar13 + 1;
        if (0 < (int)uVar2) {
          uVar18 = 0;
          do {
            if (iVar16 <= (int)(uVar14 + (int)uVar18)) goto LAB_006b6c46;
            local_48[uVar18] = piVar4[(ulong)uVar13 + uVar18 + 1];
            uVar18 = uVar18 + 1;
          } while (uVar2 != uVar18);
          uVar14 = uVar14 + (int)uVar18;
        }
        uVar13 = uVar14;
        if ((ulong)uVar2 == 3) {
          lVar15 = (long)(int)local_48[0];
          if ((lVar15 < 0) || (pVVar6->nSize <= (int)local_48[0])) goto LAB_006b6c46;
          uVar18 = (ulong)local_48[2];
          piVar5 = piVar7;
          if (piVar7[lVar15] == 0) {
LAB_006b6b2a:
            piVar5[lVar15] = local_48[2];
            iVar16 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[0]) goto LAB_006b6c46;
            iVar16 = 1;
            piVar5 = __s;
            if (__s[lVar15] == 0) goto LAB_006b6b2a;
          }
          if (((int)local_48[2] < 0) || (pVVar6->nSize <= (int)local_48[2])) goto LAB_006b6c46;
          puVar20 = (uint *)(piVar7 + uVar18);
          puVar12 = puVar20;
          if (*puVar20 == 0) {
LAB_006b6b6d:
            *puVar12 = local_48[0];
            iVar10 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[2]) goto LAB_006b6c46;
            iVar10 = 1;
            if (__s[uVar18] == 0) {
              puVar12 = (uint *)(__s + uVar18);
              goto LAB_006b6b6d;
            }
          }
          lVar15 = (long)(int)local_48[1];
          if ((lVar15 < 0) || (pVVar6->nSize <= (int)local_48[1])) goto LAB_006b6c46;
          piVar5 = piVar7;
          if (piVar7[lVar15] == 0) {
LAB_006b6bc2:
            piVar5[lVar15] = local_48[2];
            iVar11 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[1]) goto LAB_006b6c46;
            iVar11 = 1;
            piVar5 = __s;
            if (__s[lVar15] == 0) goto LAB_006b6bc2;
          }
          if (pVVar6->nSize <= (int)local_48[2]) goto LAB_006b6c46;
          if (*puVar20 == 0) {
LAB_006b6bec:
            *puVar20 = local_48[1];
            iVar19 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[2]) goto LAB_006b6c46;
            iVar19 = 1;
            if (__s[uVar18] == 0) {
              puVar20 = (uint *)(__s + uVar18);
              goto LAB_006b6bec;
            }
          }
          iVar17 = iVar16 + iVar17 + iVar10 + iVar11 + iVar19;
        }
        else if (uVar2 == 2) {
          lVar15 = (long)(int)local_48[0];
          if ((lVar15 < 0) || (pVVar6->nSize <= (int)local_48[0])) goto LAB_006b6c46;
          uVar18 = (ulong)local_48[1];
          piVar5 = piVar7;
          if (piVar7[lVar15] == 0) {
LAB_006b6ae1:
            piVar5[lVar15] = local_48[1];
            iVar16 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[0]) goto LAB_006b6c46;
            iVar16 = 1;
            piVar5 = __s;
            if (__s[lVar15] == 0) goto LAB_006b6ae1;
          }
          if (((int)local_48[1] < 0) || (pVVar6->nSize <= (int)local_48[1])) goto LAB_006b6c46;
          piVar5 = piVar7;
          if (piVar7[uVar18] == 0) {
LAB_006b6bb1:
            piVar5[uVar18] = local_48[0];
            iVar10 = 0;
          }
          else {
            if (pVVar8->nSize <= (int)local_48[1]) goto LAB_006b6c46;
            iVar10 = 1;
            piVar5 = __s;
            if (__s[uVar18] == 0) goto LAB_006b6bb1;
          }
          iVar17 = iVar16 + iVar17 + iVar10;
        }
        iVar9 = iVar9 + 1;
        iVar16 = pVVar3->nSize;
      } while ((int)uVar13 < iVar16);
    }
    if (iVar1 != iVar9) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x98,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
    }
    if (iVar17 != 0) {
      printf("Skipped %d illegal edges.\n");
      return;
    }
  }
  return;
}

Assistant:

void Gia_ManConvertPackingToEdges( Gia_Man_t * p )
{
    int i, k, Entry, nEntries, nEntries2, nNodes[4], Count = 0;
    if ( p->vPacking == NULL )
        return;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // iterate through structures
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
            nNodes[k] = Vec_IntEntry(p->vPacking, i);
        i--;
        nEntries2++;
        // create edges
        if ( Entry == 2 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[1], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[0], p->vEdge1, p->vEdge2 );
        }
        else if ( Entry == 3 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[0], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[1], p->vEdge1, p->vEdge2 );
        }
    }
    assert( nEntries == nEntries2 );
    if ( Count )
        printf( "Skipped %d illegal edges.\n", Count );
}